

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

bool leveldb::ConsumeDecimalNumber(Slice *in,uint64_t *val)

{
  byte bVar1;
  byte *pbVar2;
  size_t sVar3;
  size_t digits_consumed;
  byte *pbStack_50;
  uint8_t ch;
  uint8_t *current;
  uint8_t *end;
  uint8_t *start;
  uint64_t value;
  char kLastDigitOfMaxUint64;
  uint64_t kMaxUint64;
  uint64_t *val_local;
  Slice *in_local;
  
  start = (uint8_t *)0x0;
  pbVar2 = (byte *)Slice::data(in);
  sVar3 = Slice::size(in);
  pbStack_50 = pbVar2;
  while( true ) {
    if (((pbStack_50 == pbVar2 + sVar3) || (bVar1 = *pbStack_50, bVar1 < 0x30)) || (0x39 < bVar1)) {
      *val = (uint64_t)start;
      Slice::remove_prefix(in,(long)pbStack_50 - (long)pbVar2);
      return (long)pbStack_50 - (long)pbVar2 != 0;
    }
    if (((uint8_t *)0x1999999999999999 < start) ||
       ((start == (uint8_t *)0x1999999999999999 && (0x35 < bVar1)))) break;
    start = (uint8_t *)((long)start * 10 + (long)(int)(bVar1 - 0x30));
    pbStack_50 = pbStack_50 + 1;
  }
  return false;
}

Assistant:

bool ConsumeDecimalNumber(Slice* in, uint64_t* val) {
  // Constants that will be optimized away.
  constexpr const uint64_t kMaxUint64 = std::numeric_limits<uint64_t>::max();
  constexpr const char kLastDigitOfMaxUint64 =
      '0' + static_cast<char>(kMaxUint64 % 10);

  uint64_t value = 0;

  // reinterpret_cast-ing from char* to uint8_t* to avoid signedness.
  const uint8_t* start = reinterpret_cast<const uint8_t*>(in->data());

  const uint8_t* end = start + in->size();
  const uint8_t* current = start;
  for (; current != end; ++current) {
    const uint8_t ch = *current;
    if (ch < '0' || ch > '9') break;

    // Overflow check.
    // kMaxUint64 / 10 is also constant and will be optimized away.
    if (value > kMaxUint64 / 10 ||
        (value == kMaxUint64 / 10 && ch > kLastDigitOfMaxUint64)) {
      return false;
    }

    value = (value * 10) + (ch - '0');
  }

  *val = value;
  const size_t digits_consumed = current - start;
  in->remove_prefix(digits_consumed);
  return digits_consumed != 0;
}